

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FtsUnicodeIsdiacritic(int c)

{
  uint uVar1;
  
  uVar1 = 0;
  if (0xffffffcd < c - 0x332U) {
    uVar1 = 1 << ((byte)c & 0x1f);
    if ((uint)c < 800) {
      return uVar1 & 0x8029fdf;
    }
    uVar1 = uVar1 & 0x361f8;
  }
  return uVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3FtsUnicodeIsdiacritic(int c){
  unsigned int mask0 = 0x08029FDF;
  unsigned int mask1 = 0x000361F8;
  if( c<768 || c>817 ) return 0;
  return (c < 768+32) ?
      (mask0 & ((unsigned int)1 << (c-768))) :
      (mask1 & ((unsigned int)1 << (c-768-32)));
}